

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_opt.c
# Opt level: O3

MPP_RET mpp_opt_parse(MppOpt opt,int argc,char **argv)

{
  char *pcVar1;
  code *pcVar2;
  MPP_RET MVar3;
  MPP_RET MVar4;
  long lVar5;
  int iVar6;
  MppOptImpl *impl;
  undefined8 in_R9;
  int iVar7;
  char *pcVar8;
  undefined8 uVar9;
  
  MVar3 = MPP_NOK;
  MVar4 = MPP_NOK;
  if ((((opt != (MppOpt)0x0) && (uVar9 = 0xffffffff, MVar4 = MVar3, argv != (char **)0x0)) &&
      (1 < argc)) && (*(long *)((long)opt + 8) != 0)) {
    iVar6 = 0;
    do {
      iVar7 = iVar6 + 1;
      if (iVar7 < argc) {
        pcVar8 = argv[iVar7];
      }
      else {
        pcVar8 = (char *)0x0;
      }
      pcVar1 = argv[iVar6];
      if (pcVar1 == (char *)0x0) {
        return MPP_OK;
      }
      if ((*pcVar1 == '-') && (pcVar1[1] != '\0')) {
        lVar5 = mpp_trie_get_info(*(undefined8 *)((long)opt + 8),pcVar1 + 1);
        if (lVar5 == 0) {
          _mpp_log_l(2,"mpp_opt","invalid option %s\n",0,pcVar1 + 1,in_R9,uVar9);
        }
        else {
          pcVar2 = *(code **)(lVar5 + 0x1c + (ulong)*(byte *)(lVar5 + 3));
          if (pcVar2 == (code *)0x0) {
            MVar4 = MPP_OK;
          }
          else {
            MVar4 = (*pcVar2)(*opt,pcVar8);
            if (MVar4 < MPP_OK) {
              return MVar4;
            }
          }
          iVar7 = iVar7 + MVar4;
        }
      }
      MVar4 = MPP_OK;
      iVar6 = iVar7;
    } while (iVar7 <= argc);
  }
  return MVar4;
}

Assistant:

MPP_RET mpp_opt_parse(MppOpt opt, int argc, char **argv)
{
    MppOptImpl *impl = (MppOptImpl *)opt;
    MPP_RET ret = MPP_NOK;
    RK_S32 opt_idx = 0;

    if (NULL == impl || NULL == impl->trie || argc < 2 || NULL == argv)
        return ret;

    ret = MPP_OK;

    while (opt_idx <= argc) {
        RK_S32 opt_next = opt_idx + 1;
        char *opts = argv[opt_idx++];
        char *next = (opt_next >= argc) ? NULL : argv[opt_next];

        if (NULL == opts)
            break;

        if (opts[0] == '-' && opts[1] != '\0') {
            MppOptInfo *info = NULL;
            MppTrieInfo *node = mpp_trie_get_info(impl->trie, opts + 1);
            RK_S32 step = 0;

            if (NULL == node) {
                mpp_err("invalid option %s\n", opts + 1);
                continue;
            }

            info = mpp_trie_info_ctx(node);
            if (info->proc)
                step = info->proc(impl->ctx, next);

            /* option failure or help */
            if (step < 0) {
                ret = step;
                break;
            }

            opt_idx += step;
        }
    }

    return ret;
}